

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itersolv.c
# Opt level: O2

Vector * CGIter(QMatrix *A,Vector *x,Vector *b,int MaxIter,PrecondProcType PrecondProc,
               double OmegaPrecond)

{
  Boolean BVar1;
  LASErrIdType LVar2;
  size_t Dim;
  Vector *pVVar3;
  int iVar4;
  double bNorm;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double local_130;
  Vector r;
  Vector q;
  Vector p;
  Vector z;
  
  Q_Lock(A);
  V_Lock(x);
  V_Lock(b);
  Dim = Q_GetDim(A);
  V_Constr(&r,"r",Dim,Normal,True);
  V_Constr(&p,"p",Dim,Normal,True);
  V_Constr(&q,"q",Dim,Normal,True);
  if ((PrecondProc != (PrecondProcType)0x0) || (BVar1 = Q_KerDefined(A), BVar1 != False)) {
    V_Constr(&z,"z",Dim,Normal,True);
  }
  LVar2 = LASResult();
  if (LVar2 == LASOK) {
    bNorm = l2Norm_V(b);
    dVar5 = l1Norm_V(x);
    auVar7._8_4_ = (int)(Dim >> 0x20);
    auVar7._0_8_ = Dim;
    auVar7._12_4_ = 0x45300000;
    pVVar3 = b;
    if (2.2250738585072014e-307 <=
        ABS(dVar5 / ((auVar7._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)Dim) - 4503599627370496.0)))) {
      BVar1 = Q_KerDefined(A);
      if (BVar1 != False) {
        OrthoRightKer_VQ(x,A);
      }
      pVVar3 = Mul_QV(A,x);
      pVVar3 = Sub_VV(b,pVVar3);
    }
    Asgn_VV(&r,pVVar3);
    if ((PrecondProc == (PrecondProcType)0x0) && (BVar1 = Q_KerDefined(A), BVar1 == False)) {
      iVar4 = 0;
      local_130 = 0.0;
      while( true ) {
        dVar5 = l2Norm_V(&r);
        BVar1 = RTCResult(iVar4,dVar5,bNorm,CGIterId);
        if ((BVar1 != False) || (MaxIter <= iVar4)) break;
        dVar5 = l2Norm_V(&r);
        dVar5 = dVar5 * dVar5;
        pVVar3 = &r;
        if (iVar4 != 0) {
          pVVar3 = Mul_SV(dVar5 / local_130,&p);
          pVVar3 = Add_VV(&r,pVVar3);
        }
        Asgn_VV(&p,pVVar3);
        pVVar3 = Mul_QV(A,&p);
        Asgn_VV(&q,pVVar3);
        dVar6 = Mul_VV(&p,&q);
        pVVar3 = Mul_SV(dVar5 / dVar6,&p);
        AddAsgn_VV(x,pVVar3);
        pVVar3 = Mul_SV(dVar5 / dVar6,&q);
        SubAsgn_VV(&r,pVVar3);
        iVar4 = iVar4 + 1;
        local_130 = dVar5;
      }
    }
    else {
      iVar4 = 0;
      local_130 = 0.0;
      while( true ) {
        dVar5 = l2Norm_V(&r);
        BVar1 = RTCResult(iVar4,dVar5,bNorm,CGIterId);
        if ((BVar1 != False) || (MaxIter <= iVar4)) break;
        if (PrecondProc == (PrecondProcType)0x0) {
          Asgn_VV(&z,&r);
        }
        else {
          (*PrecondProc)(A,&z,&r,OmegaPrecond);
        }
        BVar1 = Q_KerDefined(A);
        if (BVar1 != False) {
          OrthoRightKer_VQ(&z,A);
        }
        dVar5 = Mul_VV(&r,&z);
        pVVar3 = &z;
        if (iVar4 != 0) {
          pVVar3 = Mul_SV(dVar5 / local_130,&p);
          pVVar3 = Add_VV(&z,pVVar3);
        }
        Asgn_VV(&p,pVVar3);
        pVVar3 = Mul_QV(A,&p);
        Asgn_VV(&q,pVVar3);
        dVar6 = Mul_VV(&p,&q);
        pVVar3 = Mul_SV(dVar5 / dVar6,&p);
        AddAsgn_VV(x,pVVar3);
        pVVar3 = Mul_SV(dVar5 / dVar6,&q);
        SubAsgn_VV(&r,pVVar3);
        iVar4 = iVar4 + 1;
        local_130 = dVar5;
      }
    }
    BVar1 = Q_KerDefined(A);
    if (BVar1 != False) {
      OrthoRightKer_VQ(x,A);
    }
  }
  V_Destr(&r);
  V_Destr(&p);
  V_Destr(&q);
  if ((PrecondProc != (PrecondProcType)0x0) || (BVar1 = Q_KerDefined(A), BVar1 != False)) {
    V_Destr(&z);
  }
  Q_Unlock(A);
  V_Unlock(x);
  V_Unlock(b);
  return x;
}

Assistant:

Vector *CGIter(QMatrix *A, Vector *x, Vector *b, int MaxIter,
            PrecondProcType PrecondProc, double OmegaPrecond)
{
    /*
     *  for details to the algorithm see
     *
     *  R. Barrett, M. Berry, T. F. Chan, J. Demmel, J. Donato, J. Dongarra,
     *  V. Eijkhout, R. Pozo, Ch. Romine, H. van der Vorst:
     *  Templates for the Solution of Linear Systems: Building Blocks
     *  for Iterative Solvers;
     *  SIAM, Philadelphia, 1994
     *
     */

    int Iter;
    double Alpha, Beta, Rho, RhoOld = 0.0;
    double bNorm;
    size_t Dim;
    Vector r, p, q, z;

    Q_Lock(A);
    V_Lock(x);
    V_Lock(b);
    
    Dim = Q_GetDim(A);
    V_Constr(&r, "r", Dim, Normal, True);
    V_Constr(&p, "p", Dim, Normal, True);
    V_Constr(&q, "q", Dim, Normal, True);
    if (PrecondProc != NULL || Q_KerDefined(A))
        V_Constr(&z, "z", Dim, Normal, True);

    if (LASResult() == LASOK) {
        bNorm = l2Norm_V(b);
        
        Iter = 0;
        /* r = b - A * x(i) */
        if (!IsZero(l1Norm_V(x) / Dim)) {
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
            Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
        } else {
            Asgn_VV(&r, b);
	}
        if (PrecondProc != NULL || Q_KerDefined(A)) {
            /* preconditioned CG */
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, CGIterId)
                && Iter < MaxIter) {
                Iter++;
		if (PrecondProc != NULL)
                    (*PrecondProc)(A, &z, &r, OmegaPrecond);
		else
		    Asgn_VV(&z, &r);
		if (Q_KerDefined(A))
		   OrthoRightKer_VQ(&z, A);
                Rho = Mul_VV(&r, &z);
                if (Iter == 1) {
                    Asgn_VV(&p, &z);
                } else {
                    Beta = Rho / RhoOld;
                    Asgn_VV(&p, Add_VV(&z, Mul_SV(Beta, &p)));
                }
                Asgn_VV(&q, Mul_QV(A, &p));
                Alpha = Rho / Mul_VV(&p, &q);
                AddAsgn_VV(x, Mul_SV(Alpha, &p));
                SubAsgn_VV(&r, Mul_SV(Alpha, &q));
                RhoOld = Rho;
            }
        } else {
            /* plain CG (z = r) */
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, CGIterId)
                && Iter < MaxIter) {
                Iter++;
                Rho = pow(l2Norm_V(&r), 2.0);
                if (Iter == 1) {
                    Asgn_VV(&p, &r);
                } else {
                    Beta = Rho / RhoOld;
                    Asgn_VV(&p, Add_VV(&r, Mul_SV(Beta, &p)));
                }
                Asgn_VV(&q, Mul_QV(A, &p));
                Alpha = Rho / Mul_VV(&p, &q);
                AddAsgn_VV(x, Mul_SV(Alpha, &p));
                SubAsgn_VV(&r, Mul_SV(Alpha, &q));
                RhoOld = Rho;
            }
        }
        if (Q_KerDefined(A))
	   OrthoRightKer_VQ(x, A);
    }
    
    V_Destr(&r);
    V_Destr(&p);
    V_Destr(&q);
    if (PrecondProc != NULL || Q_KerDefined(A))
        V_Destr(&z);

    Q_Unlock(A);
    V_Unlock(x);
    V_Unlock(b);

    return(x);
}